

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItemPrivate::updateSceneTransformFromParent(QGraphicsItemPrivate *this)

{
  bool bVar1;
  int iVar2;
  QGraphicsItemPrivate *pQVar3;
  long in_RDI;
  long in_FS_OFFSET;
  qreal qVar4;
  double dVar5;
  qreal qVar6;
  QPointF *in_stack_fffffffffffffd80;
  QTransform *in_stack_fffffffffffffd98;
  TransformData *in_stack_fffffffffffffda0;
  undefined1 local_238 [80];
  undefined1 local_1e8 [80];
  undefined1 local_198 [80];
  undefined1 local_148 [80];
  undefined1 local_f8 [80];
  undefined1 local_a8 [80];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x90) == 0) {
    if (*(long *)(in_RDI + 0xb0) == 0) {
      qVar4 = QPointF::x((QPointF *)(in_RDI + 0x68));
      qVar6 = QPointF::y((QPointF *)(in_RDI + 0x68));
      QTransform::fromTranslate(qVar4,qVar6);
      memcpy((void *)(in_RDI + 0xc0),local_f8,0x4a);
      *(ulong *)(in_RDI + 0x160) =
           *(ulong *)(in_RDI + 0x160) & 0xbfffffffffffffff | 0x4000000000000000;
    }
    else if ((*(byte *)(*(long *)(in_RDI + 0xb0) + 0x88) & 1) == 0) {
      bVar1 = QPointF::isNull(in_stack_fffffffffffffd80);
      if (bVar1) {
        TransformData::computedFullTransform(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        memcpy((void *)(in_RDI + 0xc0),local_198,0x4a);
        iVar2 = QTransform::type();
        *(ulong *)(in_RDI + 0x160) =
             *(ulong *)(in_RDI + 0x160) & 0xbfffffffffffffff | (ulong)(iVar2 < 2) << 0x3e;
      }
      else {
        qVar4 = QPointF::x((QPointF *)(in_RDI + 0x68));
        qVar6 = QPointF::y((QPointF *)(in_RDI + 0x68));
        QTransform::fromTranslate(qVar4,qVar6);
        memcpy((void *)(in_RDI + 0xc0),local_1e8,0x4a);
        TransformData::computedFullTransform(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        memcpy((void *)(in_RDI + 0xc0),local_238,0x4a);
        iVar2 = QTransform::type();
        *(ulong *)(in_RDI + 0x160) =
             *(ulong *)(in_RDI + 0x160) & 0xbfffffffffffffff | (ulong)(iVar2 < 2) << 0x3e;
      }
    }
    else {
      memcpy((void *)(in_RDI + 0xc0),*(void **)(in_RDI + 0xb0),0x4a);
      bVar1 = QPointF::isNull(in_stack_fffffffffffffd80);
      if (!bVar1) {
        qVar4 = QPointF::x((QPointF *)(in_RDI + 0x68));
        qVar6 = QPointF::y((QPointF *)(in_RDI + 0x68));
        QTransform::fromTranslate(qVar4,qVar6);
        QTransform::operator*=((QTransform *)(in_RDI + 0xc0),(QTransform *)local_148);
      }
      iVar2 = QTransform::type();
      *(ulong *)(in_RDI + 0x160) =
           *(ulong *)(in_RDI + 0x160) & 0xbfffffffffffffff | (ulong)(iVar2 < 2) << 0x3e;
    }
  }
  else {
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(*(long *)(in_RDI + 0x90) + 8));
    if ((*(ulong *)&pQVar3->field_0x160 >> 0x3e & 1) == 0) {
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(*(long *)(in_RDI + 0x90) + 8));
      memcpy((void *)(in_RDI + 0xc0),&pQVar3->sceneTransform,0x4a);
      in_stack_fffffffffffffd98 = (QTransform *)QPointF::x((QPointF *)(in_RDI + 0x68));
      qVar4 = QPointF::y((QPointF *)(in_RDI + 0x68));
      QTransform::translate((double)in_stack_fffffffffffffd98,qVar4);
    }
    else {
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(*(long *)(in_RDI + 0x90) + 8));
      in_stack_fffffffffffffda0 = (TransformData *)QTransform::dx(&pQVar3->sceneTransform);
      qVar4 = QPointF::x((QPointF *)(in_RDI + 0x68));
      dVar5 = (double)in_stack_fffffffffffffda0 + qVar4;
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(*(long *)(in_RDI + 0x90) + 8));
      qVar4 = QTransform::dy(&pQVar3->sceneTransform);
      qVar6 = QPointF::y((QPointF *)(in_RDI + 0x68));
      QTransform::fromTranslate(dVar5,qVar4 + qVar6);
      memcpy((void *)(in_RDI + 0xc0),local_58,0x4a);
    }
    if (*(long *)(in_RDI + 0xb0) == 0) {
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)(*(long *)(in_RDI + 0x90) + 8));
      *(ulong *)(in_RDI + 0x160) =
           *(ulong *)(in_RDI + 0x160) & 0xbfffffffffffffff |
           (ulong)((uint)((ulong)*(undefined8 *)&pQVar3->field_0x160 >> 0x3e) & 1) << 0x3e;
    }
    else {
      TransformData::computedFullTransform(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      memcpy((void *)(in_RDI + 0xc0),local_a8,0x4a);
      iVar2 = QTransform::type();
      *(ulong *)(in_RDI + 0x160) =
           *(ulong *)(in_RDI + 0x160) & 0xbfffffffffffffff | (ulong)(iVar2 < 2) << 0x3e;
    }
  }
  *(byte *)(in_RDI + 0x166) = *(byte *)(in_RDI + 0x166) & 0xdf;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::updateSceneTransformFromParent()
{
    if (parent) {
        Q_ASSERT(!parent->d_ptr->dirtySceneTransform);
        if (parent->d_ptr->sceneTransformTranslateOnly) {
            sceneTransform = QTransform::fromTranslate(parent->d_ptr->sceneTransform.dx() + pos.x(),
                                                       parent->d_ptr->sceneTransform.dy() + pos.y());
        } else {
            sceneTransform = parent->d_ptr->sceneTransform;
            sceneTransform.translate(pos.x(), pos.y());
        }
        if (transformData) {
            sceneTransform = transformData->computedFullTransform(&sceneTransform);
            sceneTransformTranslateOnly = (sceneTransform.type() <= QTransform::TxTranslate);
        } else {
            sceneTransformTranslateOnly = parent->d_ptr->sceneTransformTranslateOnly;
        }
    } else if (!transformData) {
        sceneTransform = QTransform::fromTranslate(pos.x(), pos.y());
        sceneTransformTranslateOnly = 1;
    } else if (transformData->onlyTransform) {
        sceneTransform = transformData->transform;
        if (!pos.isNull())
            sceneTransform *= QTransform::fromTranslate(pos.x(), pos.y());
        sceneTransformTranslateOnly = (sceneTransform.type() <= QTransform::TxTranslate);
    } else if (pos.isNull()) {
        sceneTransform = transformData->computedFullTransform();
        sceneTransformTranslateOnly = (sceneTransform.type() <= QTransform::TxTranslate);
    } else {
        sceneTransform = QTransform::fromTranslate(pos.x(), pos.y());
        sceneTransform = transformData->computedFullTransform(&sceneTransform);
        sceneTransformTranslateOnly = (sceneTransform.type() <= QTransform::TxTranslate);
    }
    dirtySceneTransform = 0;
}